

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

void ma_dr_wav_s24_to_f32(float *pOut,ma_uint8 *pIn,size_t sampleCount)

{
  size_t sVar1;
  byte *pbVar2;
  
  if (sampleCount != 0 && (pIn != (ma_uint8 *)0x0 && pOut != (float *)0x0)) {
    pbVar2 = pIn + 2;
    sVar1 = 0;
    do {
      pOut[sVar1] = (float)((int)((uint)*pbVar2 << 0x18 | (uint)*(ushort *)(pbVar2 + -2) << 8) >> 8)
                    * 1.1920929e-07;
      sVar1 = sVar1 + 1;
      pbVar2 = pbVar2 + 3;
    } while (sampleCount != sVar1);
  }
  return;
}

Assistant:

MA_API void ma_dr_wav_s24_to_f32(float* pOut, const ma_uint8* pIn, size_t sampleCount)
{
    size_t i;
    if (pOut == NULL || pIn == NULL) {
        return;
    }
    for (i = 0; i < sampleCount; ++i) {
        double x;
        ma_uint32 a = ((ma_uint32)(pIn[i*3+0]) <<  8);
        ma_uint32 b = ((ma_uint32)(pIn[i*3+1]) << 16);
        ma_uint32 c = ((ma_uint32)(pIn[i*3+2]) << 24);
        x = (double)((ma_int32)(a | b | c) >> 8);
        *pOut++ = (float)(x * 0.00000011920928955078125);
    }
}